

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int SUNQRsol(int n,sunrealtype **h,sunrealtype *q,sunrealtype *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int code;
  int q_ptr;
  int k;
  int i;
  sunrealtype temp2;
  sunrealtype temp1;
  sunrealtype s;
  sunrealtype c;
  sunrealtype *b_local;
  sunrealtype *q_local;
  sunrealtype **h_local;
  int n_local;
  
  for (k = 0; k < n; k = k + 1) {
    dVar1 = q[k * 2];
    dVar2 = q[k * 2 + 1];
    dVar3 = b[k];
    b[k] = dVar1 * dVar3 + -(dVar2 * b[k + 1]);
    b[k + 1] = dVar2 * dVar3 + dVar1 * b[k + 1];
  }
  k = n + -1;
  while( true ) {
    if (k < 0) {
      return 0;
    }
    if ((h[k][k] == 0.0) && (!NAN(h[k][k]))) break;
    b[k] = b[k] / h[k][k];
    for (i = 0; i < k; i = i + 1) {
      b[i] = -b[k] * h[i][k] + b[i];
    }
    k = k + -1;
  }
  return k + 1;
}

Assistant:

int SUNQRsol(int n, sunrealtype** h, sunrealtype* q, sunrealtype* b)
{
  sunrealtype c, s, temp1, temp2;
  int i, k, q_ptr, code = 0;

  /* Compute Q*b */

  for (k = 0; k < n; k++)
  {
    q_ptr    = 2 * k;
    c        = q[q_ptr];
    s        = q[q_ptr + 1];
    temp1    = b[k];
    temp2    = b[k + 1];
    b[k]     = c * temp1 - s * temp2;
    b[k + 1] = s * temp1 + c * temp2;
  }

  /* Solve  R*x = Q*b */

  for (k = n - 1; k >= 0; k--)
  {
    if (h[k][k] == ZERO)
    {
      code = k + 1;
      break;
    }
    b[k] /= h[k][k];
    for (i = 0; i < k; i++) { b[i] -= b[k] * h[i][k]; }
  }

  return (code);
}